

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_class.c
# Opt level: O3

int oonf_class_extension_add(oonf_class_extension *ext)

{
  avl_node **ci;
  avl_node *paVar1;
  size_t sVar2;
  avl_node *paVar3;
  int iVar4;
  ulong uVar5;
  
  if (((ext->_node).next == (list_entity *)0x0) ||
     (iVar4 = 0, (ext->_node).prev == (list_entity *)0x0)) {
    paVar3 = avl_find(&_classes_tree,ext->class_name);
    if (paVar3 == (avl_node *)0x0) {
      iVar4 = -1;
      if ((log_global_mask[_oonf_class_subsystem.logging] & 4) != 0) {
        oonf_log(LOG_SEVERITY_WARN,_oonf_class_subsystem.logging,"src/base/oonf_class.c",0x10b,
                 (void *)0x0,0,"Unknown class %s for extension %s",ext->class_name,ext->ext_name);
      }
    }
    else {
      ci = &paVar3[-1].parent;
      if ((*(int *)&paVar3[1].key == 0) || (ext->size == 0)) {
        paVar1 = paVar3[1].left;
        (ext->_node).next = (list_entity *)&paVar3[1].parent;
        (ext->_node).prev = &paVar1->list;
        paVar3[1].left = (avl_node *)&ext->_node;
        (paVar1->list).next = &ext->_node;
        iVar4 = 0;
        if (ext->size != 0) {
          _free_freelist((oonf_class *)ci);
          sVar2 = *(size_t *)&paVar3[-1].balance;
          ext->_offset = sVar2;
          uVar5 = sVar2 + ext->size + 0xf & 0xfffffffffffffff0;
          paVar3[-1].balance = (char)uVar5;
          paVar3[-1].follower = (_Bool)(char)(uVar5 >> 8);
          *(int6 *)&paVar3[-1].field_0x32 = (int6)(uVar5 >> 0x10);
          iVar4 = 0;
          if ((log_global_mask[_oonf_class_subsystem.logging] & 1) != 0) {
            iVar4 = 0;
            oonf_log(LOG_SEVERITY_DEBUG,_oonf_class_subsystem.logging,"src/base/oonf_class.c",0x124,
                     (void *)0x0,0,
                     "Class %s extended: %zu bytes, \'%s\' has offset %zu and length %zu\n",*ci,
                     uVar5,ext->ext_name,ext->_offset,ext->size);
          }
        }
      }
      else {
        iVar4 = -1;
        if ((log_global_mask[_oonf_class_subsystem.logging] & 4) != 0) {
          oonf_log(LOG_SEVERITY_WARN,_oonf_class_subsystem.logging,"src/base/oonf_class.c",0x110,
                   (void *)0x0,0,"Class %s is already in use and cannot be extended",*ci);
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int
oonf_class_extension_add(struct oonf_class_extension *ext) {
  struct oonf_class *c;

  if (oonf_class_is_extension_registered(ext)) {
    /* already registered */
    return 0;
  }

  c = avl_find_element(&_classes_tree, ext->class_name, c, _node);
  if (c == NULL) {
    OONF_WARN(LOG_CLASS, "Unknown class %s for extension %s", ext->class_name, ext->ext_name);
    return -1;
  }

  if (c->_allocated != 0 && ext->size > 0) {
    OONF_WARN(LOG_CLASS, "Class %s is already in use and cannot be extended", c->name);
    return -1;
  }

  /* add to class extension list */
  list_add_tail(&c->_extensions, &ext->_node);

  if (ext->size > 0) {
    /* make sure freelist is empty */
    _free_freelist(c);

    /* old size is new offset */
    ext->_offset = c->total_size;

    /* calculate new size */
    c->total_size = _roundup(c->total_size + ext->size);

    OONF_DEBUG(LOG_CLASS,
      "Class %s extended: %" PRINTF_SIZE_T_SPECIFIER " bytes,"
      " '%s' has offset %" PRINTF_SIZE_T_SPECIFIER " and length %" PRINTF_SIZE_T_SPECIFIER "\n",
      c->name, c->total_size, ext->ext_name, ext->_offset, ext->size);
  }

  return 0;
}